

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void wasm::PostWalker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::scan
               (Modder *self,Expression **currp)

{
  Expression *this;
  Block *pBVar1;
  SIMDExtract *pSVar2;
  SIMDLoad *pSVar3;
  GlobalSet *pGVar4;
  AtomicCmpxchg *pAVar5;
  Return *pRVar6;
  MemoryCopy *pMVar7;
  AtomicNotify *pAVar8;
  TupleMake *pTVar9;
  Load *pLVar10;
  CallRef *pCVar11;
  Call *pCVar12;
  StructNew *pSVar13;
  ArrayNew *pAVar14;
  ArrayNewFixed *pAVar15;
  Expression **ppEVar16;
  Break *pBVar17;
  Switch *pSVar18;
  CallIndirect *pCVar19;
  Try *pTVar20;
  Store *pSVar21;
  Throw *pTVar22;
  TupleExtract *pTVar23;
  StringNew *pSVar24;
  Expression **extraout_RDX;
  Expression **extraout_RDX_00;
  Expression **currp_00;
  Expression **extraout_RDX_01;
  Expression **extraout_RDX_02;
  Expression **currp_01;
  Expression **currp_02;
  Expression **currp_03;
  Name *currp_04;
  Expression **currp_05;
  Expression **currp_06;
  Expression **currp_07;
  ArrayInit *pAVar25;
  ulong uVar26;
  
  this = *currp;
  switch(this->_id) {
  case InvalidId:
  case NumExpressionIds:
    wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
               ,0xb0);
  case BlockId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitBlock,currp);
    pBVar1 = Expression::cast<wasm::Block>(this);
    uVar26 = (ulong)(uint)(pBVar1->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar16 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pBVar1->list).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar26);
      Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
                ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,ppEVar16
                );
    }
    return;
  case IfId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitIf,currp);
    pMVar7 = (MemoryCopy *)Expression::cast<wasm::If>(this);
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::maybePushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               (TaskFunc)&pMVar7->size,currp_02);
    goto LAB_0013a81d;
  case LoopId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitLoop,currp);
    pGVar4 = (GlobalSet *)Expression::cast<wasm::Loop>(this);
    goto LAB_0013a3ac;
  case BreakId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitBreak,currp);
    pBVar17 = Expression::cast<wasm::Break>(this);
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::maybePushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               (TaskFunc)&pBVar17->condition,currp_00);
    ppEVar16 = &pBVar17->value;
    currp_01 = extraout_RDX_01;
    goto LAB_0013a382;
  case SwitchId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitSwitch,currp);
    pSVar18 = Expression::cast<wasm::Switch>(this);
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,
               &pSVar18->condition);
    ppEVar16 = &pSVar18->value;
    currp_01 = extraout_RDX_02;
    goto LAB_0013a382;
  case CallId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitCall,currp);
    pCVar12 = Expression::cast<wasm::Call>(this);
    uVar26 = (ulong)(uint)(pCVar12->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar16 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar12->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar26);
      Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
                ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,ppEVar16
                );
    }
    return;
  case CallIndirectId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitCallIndirect,
               currp);
    pCVar19 = Expression::cast<wasm::CallIndirect>(this);
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,
               &pCVar19->target);
    uVar26 = (ulong)(uint)(pCVar19->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar16 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar19->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar26);
      Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
                ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,ppEVar16
                );
    }
    return;
  case LocalGetId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitLocalGet,currp)
    ;
    Expression::cast<wasm::LocalGet>(this);
    return;
  case LocalSetId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitLocalSet,currp)
    ;
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::LocalSet>(this);
    goto LAB_0013a6b1;
  case GlobalGetId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitGlobalGet,currp
              );
    Expression::cast<wasm::GlobalGet>(this);
    return;
  case GlobalSetId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitGlobalSet,currp
              );
    pGVar4 = Expression::cast<wasm::GlobalSet>(this);
    goto LAB_0013a3ac;
  case LoadId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitLoad,currp);
    pLVar10 = Expression::cast<wasm::Load>(this);
    pAVar25 = (ArrayInit *)&pLVar10->ptr;
    break;
  case StoreId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitStore,currp);
    pSVar21 = Expression::cast<wasm::Store>(this);
    goto LAB_0013a678;
  case ConstId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitConst,currp);
    Expression::cast<wasm::Const>(this);
    return;
  case UnaryId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitUnary,currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::Unary>(this);
    goto LAB_0013a6b1;
  case BinaryId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitBinary,currp);
    pAVar8 = (AtomicNotify *)Expression::cast<wasm::Binary>(this);
    goto LAB_0013a885;
  case SelectId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitSelect,currp);
    pMVar7 = (MemoryCopy *)Expression::cast<wasm::Select>(this);
    goto LAB_0013a409;
  case DropId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitDrop,currp);
    pTVar23 = (TupleExtract *)Expression::cast<wasm::Drop>(this);
    goto LAB_0013a85e;
  case ReturnId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitReturn,currp);
    pRVar6 = Expression::cast<wasm::Return>(this);
    ppEVar16 = &pRVar6->value;
    currp_01 = extraout_RDX;
    goto LAB_0013a382;
  case MemorySizeId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitMemorySize,
               currp);
    Expression::cast<wasm::MemorySize>(this);
    return;
  case MemoryGrowId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitMemoryGrow,
               currp);
    pTVar23 = (TupleExtract *)Expression::cast<wasm::MemoryGrow>(this);
    goto LAB_0013a85e;
  case NopId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitNop,currp);
    Expression::cast<wasm::Nop>(this);
    return;
  case UnreachableId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitUnreachable,
               currp);
    Expression::cast<wasm::Unreachable>(this);
    return;
  case AtomicRMWId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitAtomicRMW,currp
              );
    pAVar5 = (AtomicCmpxchg *)Expression::cast<wasm::AtomicRMW>(this);
    goto LAB_0013a72f;
  case AtomicCmpxchgId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitAtomicCmpxchg,
               currp);
    pAVar5 = Expression::cast<wasm::AtomicCmpxchg>(this);
    goto LAB_0013a712;
  case AtomicWaitId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitAtomicWait,
               currp);
    pAVar8 = (AtomicNotify *)Expression::cast<wasm::AtomicWait>(this);
    goto LAB_0013a0d8;
  case AtomicNotifyId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitAtomicNotify,
               currp);
    pAVar8 = Expression::cast<wasm::AtomicNotify>(this);
    goto LAB_0013a885;
  case AtomicFenceId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitAtomicFence,
               currp);
    Expression::cast<wasm::AtomicFence>(this);
    return;
  case SIMDExtractId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitSIMDExtract,
               currp);
    pSVar2 = Expression::cast<wasm::SIMDExtract>(this);
    goto LAB_0013a6b1;
  case SIMDReplaceId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitSIMDReplace,
               currp);
    pAVar8 = (AtomicNotify *)Expression::cast<wasm::SIMDReplace>(this);
    currp_04 = &pAVar8->memory;
    goto LAB_0013a893;
  case SIMDShuffleId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitSIMDShuffle,
               currp);
    pMVar7 = (MemoryCopy *)Expression::cast<wasm::SIMDShuffle>(this);
    goto LAB_0013a81d;
  case SIMDTernaryId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitSIMDTernary,
               currp);
    pAVar8 = (AtomicNotify *)Expression::cast<wasm::SIMDTernary>(this);
    goto LAB_0013a0d8;
  case SIMDShiftId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitSIMDShift,currp
              );
    pAVar8 = (AtomicNotify *)Expression::cast<wasm::SIMDShift>(this);
    goto LAB_0013a885;
  case SIMDLoadId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitSIMDLoad,currp)
    ;
    pSVar3 = Expression::cast<wasm::SIMDLoad>(this);
    goto LAB_0013a557;
  case SIMDLoadStoreLaneId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::
               doVisitSIMDLoadStoreLane,currp);
    pSVar21 = (Store *)Expression::cast<wasm::SIMDLoadStoreLane>(this);
LAB_0013a678:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,
               &pSVar21->value);
    pAVar25 = (ArrayInit *)&pSVar21->ptr;
    break;
  case MemoryInitId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitMemoryInit,
               currp);
    pAVar5 = (AtomicCmpxchg *)Expression::cast<wasm::MemoryInit>(this);
LAB_0013a712:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,
               (Expression **)&pAVar5->replacement);
    goto LAB_0013a72f;
  case DataDropId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitDataDrop,currp)
    ;
    Expression::cast<wasm::DataDrop>(this);
    return;
  case MemoryCopyId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitMemoryCopy,
               currp);
    pMVar7 = Expression::cast<wasm::MemoryCopy>(this);
    goto LAB_0013a409;
  case MemoryFillId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitMemoryFill,
               currp);
    pMVar7 = (MemoryCopy *)Expression::cast<wasm::MemoryFill>(this);
    goto LAB_0013a409;
  case PopId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitPop,currp);
    Expression::cast<wasm::Pop>(this);
    return;
  case RefNullId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitRefNull,currp);
    Expression::cast<wasm::RefNull>(this);
    return;
  case RefIsNullId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitRefIsNull,currp
              );
    pTVar23 = (TupleExtract *)Expression::cast<wasm::RefIsNull>(this);
    goto LAB_0013a85e;
  case RefFuncId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitRefFunc,currp);
    Expression::cast<wasm::RefFunc>(this);
    return;
  case RefEqId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitRefEq,currp);
    pMVar7 = (MemoryCopy *)Expression::cast<wasm::RefEq>(this);
    goto LAB_0013a81d;
  case TableGetId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitTableGet,currp)
    ;
    pGVar4 = (GlobalSet *)Expression::cast<wasm::TableGet>(this);
LAB_0013a3ac:
    pAVar25 = (ArrayInit *)&pGVar4->value;
    break;
  case TableSetId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitTableSet,currp)
    ;
    pAVar5 = (AtomicCmpxchg *)Expression::cast<wasm::TableSet>(this);
    goto LAB_0013a72f;
  case TableSizeId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitTableSize,currp
              );
    Expression::cast<wasm::TableSize>(this);
    return;
  case TableGrowId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitTableGrow,currp
              );
    pAVar5 = (AtomicCmpxchg *)Expression::cast<wasm::TableGrow>(this);
LAB_0013a72f:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,
               &pAVar5->expected);
    pAVar25 = (ArrayInit *)&pAVar5->ptr;
    break;
  case TryId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitTry,currp);
    pTVar20 = Expression::cast<wasm::Try>(this);
    uVar26 = (ulong)*(uint *)(pTVar20 + 0x50);
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar16 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pTVar20 + 0x48),uVar26);
      Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
                ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,ppEVar16
                );
    }
    pAVar25 = (ArrayInit *)(pTVar20 + 0x20);
    break;
  case ThrowId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitThrow,currp);
    pTVar22 = Expression::cast<wasm::Throw>(this);
    uVar26 = (ulong)*(uint *)(pTVar22 + 0x28);
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar16 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            (pTVar22 + 0x20),uVar26);
      Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
                ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,ppEVar16
                );
    }
    return;
  case RethrowId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitRethrow,currp);
    Expression::cast<wasm::Rethrow>(this);
    return;
  case TupleMakeId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitTupleMake,currp
              );
    pTVar9 = Expression::cast<wasm::TupleMake>(this);
    uVar26 = (ulong)(uint)(pTVar9->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar16 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar9->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar26);
      Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
                ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,ppEVar16
                );
    }
    return;
  case TupleExtractId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitTupleExtract,
               currp);
    pTVar23 = Expression::cast<wasm::TupleExtract>(this);
    goto LAB_0013a85e;
  case I31NewId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitI31New,currp);
    pTVar23 = (TupleExtract *)Expression::cast<wasm::I31New>(this);
    goto LAB_0013a85e;
  case I31GetId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitI31Get,currp);
    pTVar23 = (TupleExtract *)Expression::cast<wasm::I31Get>(this);
    goto LAB_0013a85e;
  case CallRefId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitCallRef,currp);
    pCVar11 = Expression::cast<wasm::CallRef>(this);
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,
               &pCVar11->target);
    uVar26 = (ulong)(uint)(pCVar11->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar16 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar11->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar26);
      Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
                ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,ppEVar16
                );
    }
    return;
  case RefTestId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitRefTest,currp);
    pTVar23 = (TupleExtract *)Expression::cast<wasm::RefTest>(this);
    goto LAB_0013a85e;
  case RefCastId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitRefCast,currp);
    pTVar23 = (TupleExtract *)Expression::cast<wasm::RefCast>(this);
    goto LAB_0013a85e;
  case BrOnId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitBrOn,currp);
    pSVar3 = (SIMDLoad *)Expression::cast<wasm::BrOn>(this);
LAB_0013a557:
    pAVar25 = (ArrayInit *)&pSVar3->ptr;
    break;
  case StructNewId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitStructNew,currp
              );
    pSVar13 = Expression::cast<wasm::StructNew>(this);
    uVar26 = (ulong)(uint)(pSVar13->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar16 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pSVar13->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar26);
      Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
                ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,ppEVar16
                );
    }
    return;
  case StructGetId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitStructGet,currp
              );
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::StructGet>(this);
    goto LAB_0013a6b1;
  case StructSetId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitStructSet,currp
              );
    pAVar8 = (AtomicNotify *)Expression::cast<wasm::StructSet>(this);
    goto LAB_0013a885;
  case ArrayNewId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitArrayNew,currp)
    ;
    pAVar14 = Expression::cast<wasm::ArrayNew>(this);
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,
               &pAVar14->size);
    ppEVar16 = &pAVar14->init;
    currp_01 = extraout_RDX_00;
LAB_0013a382:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::maybePushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               (TaskFunc)ppEVar16,currp_01);
    return;
  case ArrayNewSegId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitArrayNewSeg,
               currp);
    pAVar25 = (ArrayInit *)Expression::cast<wasm::ArrayNewSeg>(this);
    goto LAB_0013a261;
  case ArrayNewFixedId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitArrayNewFixed,
               currp);
    pAVar15 = Expression::cast<wasm::ArrayNewFixed>(this);
    uVar26 = (ulong)(uint)(pAVar15->values).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      ppEVar16 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pAVar15->values).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar26);
      Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
                ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,ppEVar16
                );
    }
    return;
  case ArrayGetId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitArrayGet,currp)
    ;
    pMVar7 = (MemoryCopy *)Expression::cast<wasm::ArrayGet>(this);
    goto LAB_0013a81d;
  case ArraySetId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitArraySet,currp)
    ;
    pMVar7 = (MemoryCopy *)Expression::cast<wasm::ArraySet>(this);
    goto LAB_0013a409;
  case ArrayLenId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitArrayLen,currp)
    ;
    pTVar23 = (TupleExtract *)Expression::cast<wasm::ArrayLen>(this);
    goto LAB_0013a85e;
  case ArrayCopyId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitArrayCopy,currp
              );
    pMVar7 = (MemoryCopy *)Expression::cast<wasm::ArrayCopy>(this);
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,
               (Expression **)&(pMVar7->destMemory).super_IString.str._M_str);
    goto LAB_0013a091;
  case ArrayFillId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitArrayFill,currp
              );
    pMVar7 = (MemoryCopy *)Expression::cast<wasm::ArrayFill>(this);
LAB_0013a091:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,
               (Expression **)&pMVar7->destMemory);
    goto LAB_0013a409;
  case ArrayInitId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitArrayInit,currp
              );
    pAVar25 = Expression::cast<wasm::ArrayInit>(this);
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,
               (Expression **)(pAVar25 + 0x40));
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,
               (Expression **)(pAVar25 + 0x38));
LAB_0013a261:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,
               (Expression **)(pAVar25 + 0x30));
    pAVar25 = pAVar25 + 0x28;
    break;
  case RefAsId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitRefAs,currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::RefAs>(this);
    goto LAB_0013a6b1;
  case StringNewId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitStringNew,currp
              );
    pSVar24 = Expression::cast<wasm::StringNew>(this);
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::maybePushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               (TaskFunc)(pSVar24 + 0x30),currp_05);
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::maybePushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               (TaskFunc)(pSVar24 + 0x28),currp_06);
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::maybePushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               (TaskFunc)(pSVar24 + 0x20),currp_07);
    pAVar25 = (ArrayInit *)(pSVar24 + 0x18);
    break;
  case StringConstId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitStringConst,
               currp);
    Expression::cast<wasm::StringConst>(this);
    return;
  case StringMeasureId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitStringMeasure,
               currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::StringMeasure>(this);
    goto LAB_0013a6b1;
  case StringEncodeId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitStringEncode,
               currp);
    pAVar8 = (AtomicNotify *)Expression::cast<wasm::StringEncode>(this);
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::maybePushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               (TaskFunc)&pAVar8->memory,currp_03);
    currp_04 = (Name *)&pAVar8->notifyCount;
    goto LAB_0013a893;
  case StringConcatId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitStringConcat,
               currp);
    pMVar7 = (MemoryCopy *)Expression::cast<wasm::StringConcat>(this);
    goto LAB_0013a81d;
  case StringEqId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitStringEq,currp)
    ;
    pAVar8 = (AtomicNotify *)Expression::cast<wasm::StringEq>(this);
    goto LAB_0013a885;
  case StringAsId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitStringAs,currp)
    ;
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::StringAs>(this);
LAB_0013a6b1:
    pAVar25 = (ArrayInit *)&pSVar2->vec;
    break;
  case StringWTF8AdvanceId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::
               doVisitStringWTF8Advance,currp);
    pMVar7 = (MemoryCopy *)Expression::cast<wasm::StringWTF8Advance>(this);
LAB_0013a409:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,
               &pMVar7->size);
    goto LAB_0013a81d;
  case StringWTF16GetId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitStringWTF16Get,
               currp);
    pMVar7 = (MemoryCopy *)Expression::cast<wasm::StringWTF16Get>(this);
    goto LAB_0013a81d;
  case StringIterNextId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitStringIterNext,
               currp);
    pTVar23 = (TupleExtract *)Expression::cast<wasm::StringIterNext>(this);
LAB_0013a85e:
    pAVar25 = (ArrayInit *)&pTVar23->tuple;
    break;
  case StringIterMoveId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitStringIterMove,
               currp);
    pAVar8 = (AtomicNotify *)Expression::cast<wasm::StringIterMove>(this);
LAB_0013a885:
    currp_04 = (Name *)&pAVar8->notifyCount;
LAB_0013a893:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,
               (Expression **)currp_04);
    pAVar25 = (ArrayInit *)&pAVar8->ptr;
    break;
  case StringSliceWTFId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitStringSliceWTF,
               currp);
    pAVar8 = (AtomicNotify *)Expression::cast<wasm::StringSliceWTF>(this);
LAB_0013a0d8:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,
               (Expression **)&pAVar8->memory);
    currp_04 = (Name *)&pAVar8->notifyCount;
    goto LAB_0013a893;
  case StringSliceIterId:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,
               Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::doVisitStringSliceIter
               ,currp);
    pMVar7 = (MemoryCopy *)Expression::cast<wasm::StringSliceIter>(this);
LAB_0013a81d:
    Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
              ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,
               &pMVar7->source);
    pAVar25 = (ArrayInit *)&pMVar7->dest;
    break;
  default:
    return;
  }
  Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::pushTask
            ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)self,scan,
             (Expression **)pAVar25);
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }